

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall
wabt::interp::Thread::DoSimdUnop<float,int>(Thread *this,UnopFunc<float,_int> *f)

{
  Simd<float,_(unsigned_char)__x04_> value;
  int *__first;
  int *__last;
  float *__result;
  float afStack_38 [2];
  SR result;
  Simd<int,_(unsigned_char)__x04_> val;
  UnopFunc<float,_int> *f_local;
  Thread *this_local;
  
  join_0x00000010_0x00000000_ = Pop<wabt::interp::Simd<int,(unsigned_char)4>>(this);
  __first = std::begin<int,4ul>((int (*) [4])(result.v + 2));
  __last = std::end<int,4ul>((int (*) [4])(result.v + 2));
  __result = std::begin<float,4ul>((float (*) [4])afStack_38);
  std::transform<int*,float*,float(*)(int)>(__first,__last,__result,f);
  value.v[2] = result.v[0];
  value.v[3] = result.v[1];
  value.v[0] = afStack_38[0];
  value.v[1] = afStack_38[1];
  Push<wabt::interp::Simd<float,(unsigned_char)4>>(this,value);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdUnop(UnopFunc<R, T> f) {
  using ST = typename Simd128<T>::Type;
  using SR = typename Simd128<R>::Type;
  auto val = Pop<ST>();
  SR result;
  std::transform(std::begin(val.v), std::end(val.v), std::begin(result.v), f);
  Push(result);
  return RunResult::Ok;
}